

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cc
# Opt level: O1

uchar * SHA1(uchar *d,size_t n,uchar *md)

{
  SHA_CTX ctx;
  SHA_CTX local_80;
  
  BCM_sha1_init(&local_80);
  BCM_sha1_update(&local_80,d,n);
  BCM_sha1_final(md,&local_80);
  OPENSSL_cleanse(&local_80,0x60);
  return md;
}

Assistant:

uint8_t *SHA1(const uint8_t *data, size_t len, uint8_t out[SHA_DIGEST_LENGTH]) {
  SHA_CTX ctx;
  BCM_sha1_init(&ctx);
  BCM_sha1_update(&ctx, data, len);
  BCM_sha1_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}